

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void clipme(Terminal *term,pos top,pos bottom,_Bool rect,_Bool desel,int *clipboards,
           wchar_t n_clipboards)

{
  truecolour tc;
  unsigned_long uVar1;
  undefined4 uVar2;
  pos pVar3;
  _Bool _Var4;
  wchar_t wVar5;
  wchar_t wVar6;
  termline *ptr;
  termchar *ptVar7;
  uint uVar8;
  unicode_data *puVar9;
  wchar_t *pwVar10;
  long lVar11;
  int iVar12;
  undefined7 in_register_00000081;
  long lVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  wchar_t wVar17;
  uint *puVar18;
  bool bVar19;
  wchar_t y;
  char buf_1 [4];
  clip_workbuf buf;
  wchar_t wbuf [4];
  wchar_t cbuf [16];
  wchar_t local_11c;
  char local_114;
  undefined1 local_113;
  ulong local_110;
  ulong local_108;
  undefined4 local_100;
  uint local_fc;
  wchar_t local_f8;
  int local_f4;
  long local_f0;
  clip_workbuf local_e8;
  int *local_a8;
  ulong local_a0;
  pos local_98;
  pos local_90;
  wchar_t local_88 [4];
  uint local_78 [18];
  
  local_100 = (undefined4)CONCAT71(in_register_00000081,desel);
  uVar16 = (ulong)top >> 0x20;
  uVar15 = (ulong)bottom >> 0x20;
  local_e8.bufsize = 0x1400;
  local_e8.bufpos = 0;
  local_110 = 0;
  local_a8 = clipboards;
  local_e8.textbuf = (wchar_t *)safemalloc(0x1400,4,0);
  local_e8.textptr = local_e8.textbuf;
  local_e8.attrbuf = (wchar_t *)safemalloc(0x1400,4,0);
  local_e8.attrptr = local_e8.attrbuf;
  local_e8.tcbuf = (truecolour *)safemalloc(0x1400,8,0);
  bVar19 = top.x < bottom.x;
  if (top.y != bottom.y) {
    bVar19 = top.y < bottom.y;
  }
  local_e8.tcptr = local_e8.tcbuf;
  if (bVar19) {
    if (rect) {
      local_110 = uVar16;
    }
    local_110 = local_110 & 0xffffffff;
    local_a0 = uVar15;
    local_98 = bottom;
    do {
      y = top.y;
      ptr = lineptr(term,y,L'ᤲ',L'\0');
      local_f8 = term->cols;
      wVar6 = (wchar_t)uVar15;
      wVar17 = bottom.y;
      local_11c = y;
      if ((ptr->lattr & 0x10) == 0) {
        if (local_f8 != L'\0') {
          lVar13 = (long)local_f8;
          pwVar10 = &ptr->chars[lVar13 + -1].cc_next;
          do {
            if (((((termchar *)(pwVar10 + -6))->chr != 0x20 &&
                  ((uint)((termchar *)(pwVar10 + -6))->chr & 0xfffffcff) != 0xd820) ||
                (*pwVar10 != L'\0')) || (lVar13 <= (wchar_t)uVar16)) goto LAB_0010aaa4;
            pwVar10 = pwVar10 + -8;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        lVar13 = 0;
LAB_0010aaa4:
        local_f8 = (wchar_t)lVar13;
        bVar19 = y < wVar17;
        if (y == wVar17) {
          bVar19 = local_f8 < wVar6;
        }
        local_fc = (uint)bVar19;
      }
      else {
        wVar5 = local_f8 + L'\xfffffffd';
        if (local_f8 < L'\x03') {
          wVar5 = L'\0';
        }
        if (ptr->trusted == false) {
          wVar5 = local_f8;
        }
        if ((ptr->lattr & 0x20) != 0) {
          if (wVar5 == L'\0') {
            local_fc = 0;
            local_11c = y + L'\xffffffff';
            goto LAB_0010aae8;
          }
          wVar5 = wVar5 + L'\xffffffff';
        }
        local_f8 = wVar5;
        local_fc = 0;
      }
LAB_0010aae8:
      wVar5 = wVar6;
      if (local_f8 < wVar6) {
        wVar5 = local_f8;
      }
      bVar19 = (wchar_t)uVar16 < wVar6;
      if (y != wVar17) {
        bVar19 = y < wVar17;
      }
      if (rect) {
        local_fc = (uint)(y < wVar17);
        local_f8 = wVar5;
      }
      pVar3 = top;
      if (bVar19) {
        do {
          local_90 = pVar3;
          bVar19 = local_90.y < local_11c;
          if (local_90.y == local_11c) {
            bVar19 = (wchar_t)uVar16 < local_f8;
          }
          top = local_90;
          if (!bVar19) break;
          ptVar7 = ptr->chars;
          local_108 = uVar16;
          if (ptVar7[(wchar_t)uVar16].chr != 0xdfff) {
            do {
              iVar14 = (int)uVar16;
              lVar13 = (long)iVar14;
              local_f0 = lVar13 * 0x20;
              uVar15 = ptVar7[lVar13].chr;
              uVar8 = (uint)uVar15 & 0xffffff00;
              if (uVar8 == 0xda00) {
                pwVar10 = term->ucsdata->unitab_scoacs;
LAB_0010abdf:
                uVar15 = (ulong)(uint)pwVar10[uVar15 & 0xff];
              }
              else {
                if (uVar8 == 0xd900) {
                  puVar9 = term->ucsdata;
                  if (term->rawcnp != false) goto LAB_0010abbd;
                  pwVar10 = puVar9->unitab_xterm;
                  goto LAB_0010abdf;
                }
                if (uVar8 == 0xd800) {
                  puVar9 = term->ucsdata;
LAB_0010abbd:
                  pwVar10 = puVar9->unitab_line;
                  goto LAB_0010abdf;
                }
              }
              uVar8 = (uint)uVar15 & 0xffffff00;
              if (uVar8 == 0xdd00) {
                lVar11 = 0x80c;
LAB_0010ac0a:
                uVar15 = (ulong)*(uint *)((long)term->ucsdata->unitab_scoacs +
                                         (uVar15 & 0xff) * 4 + lVar11 + -0xc);
              }
              else if (uVar8 == 0xdc00) {
                lVar11 = 0x100c;
                goto LAB_0010ac0a;
              }
              uVar1 = ptVar7[lVar13].attr;
              tc = ptVar7[lVar13].truecolour;
              local_78[0] = (uint)uVar15;
              local_78[1] = 0;
              if ((local_78[0] & 0xfffffe00) == 0xdc00) {
                if ((local_78[0] & 0xff) != 0x7f && 0x1f < (local_78[0] & 0xff)) {
                  _Var4 = is_dbcs_leadbyte(term->ucsdata->font_codepage,(char)uVar15);
                  wVar6 = L'\x01';
                  if (_Var4) {
                    iVar12 = (int)local_108;
                    local_108 = (ulong)(iVar12 + 1);
                    local_113 = (undefined1)ptr->chars[(long)iVar12 + 1].chr;
                    wVar6 = L'\x02';
                  }
                  local_114 = (char)uVar15;
                  wVar6 = mb_to_wc(term->ucsdata->font_codepage,L'\0',&local_114,wVar6,local_88,
                                   L'\x04');
                  if (L'\0' < wVar6) {
                    memcpy(local_78,local_88,(ulong)(uint)wVar6 * 4);
                    local_78[(uint)wVar6] = 0;
                    uVar15 = (ulong)local_78[0];
                  }
                  goto LAB_0010ad18;
                }
LAB_0010ad1c:
                puVar18 = local_78;
                local_f4 = iVar14;
                do {
                  puVar18 = puVar18 + 1;
                  clip_addchar(&local_e8,(wchar_t)uVar15,(wchar_t)uVar1,tc);
                  uVar15 = (ulong)*puVar18;
                  iVar14 = local_f4;
                } while (*puVar18 != 0);
              }
              else {
LAB_0010ad18:
                if ((int)uVar15 != 0) goto LAB_0010ad1c;
              }
              ptVar7 = ptr->chars;
              iVar12 = *(int *)((long)&ptVar7->cc_next + local_f0);
              uVar16 = (ulong)(uint)(iVar14 + iVar12);
            } while (iVar12 != 0);
          }
          uVar8 = (int)local_108 + 1;
          uVar16 = (ulong)uVar8;
          bVar19 = (int)uVar8 < (int)local_a0;
          if (local_90.y != local_98.y) {
            bVar19 = local_90.y < local_98.y;
          }
          uVar15 = local_a0;
          bottom = local_98;
          top = local_90;
          pVar3 = local_90;
        } while (bVar19);
      }
      if ((char)local_fc != '\0') {
        clip_addchar(&local_e8,L'\n',L'\0',(term->basic_erase_char).truecolour);
      }
      if (ptr->temporary == true) {
        safefree(ptr->chars);
        safefree(ptr);
      }
      top.y = top.y + L'\x01';
      top.x = L'\0';
      bVar19 = top.y < bottom.y;
      if (top.y == bottom.y) {
        bVar19 = (int)local_110 < (int)uVar15;
      }
      uVar16 = local_110 & 0xffffffff;
    } while (bVar19);
  }
  uVar2 = local_100;
  if (n_clipboards < L'\x01') {
LAB_0010af00:
    safefree(local_e8.textbuf);
    safefree(local_e8.attrbuf);
    safefree(local_e8.tcbuf);
  }
  else {
    bVar19 = false;
    uVar15 = 0;
    do {
      while( true ) {
        uVar16 = uVar15 + 1;
        wVar6 = local_a8[uVar15];
        uVar15 = uVar16;
        if (wVar6 != L'\0') break;
LAB_0010ae7d:
        if (uVar16 == (uint)n_clipboards) {
          if (!bVar19) goto LAB_0010af00;
          goto LAB_0010aea2;
        }
      }
      if (wVar6 != L'\x01') {
        (*term->win->vt->clip_write)
                  (term->win,wVar6,local_e8.textbuf,local_e8.attrbuf,local_e8.tcbuf,
                   (wchar_t)local_e8.bufpos,SUB41(uVar2,0));
        goto LAB_0010ae7d;
      }
      bVar19 = true;
    } while (uVar16 != (uint)n_clipboards);
LAB_0010aea2:
    safefree(term->last_selected_text);
    safefree(term->last_selected_attr);
    safefree(term->last_selected_tc);
    term->last_selected_text = local_e8.textbuf;
    term->last_selected_attr = local_e8.attrbuf;
    term->last_selected_tc = local_e8.tcbuf;
    term->last_selected_len = local_e8.bufpos;
  }
  return;
}

Assistant:

static void clipme(Terminal *term, pos top, pos bottom, bool rect, bool desel,
                   const int *clipboards, int n_clipboards)
{
    clip_workbuf buf;
    int old_top_x;
    int attr;
    truecolour tc;

    buf.bufsize = 5120;
    buf.bufpos = 0;
    buf.textptr = buf.textbuf = snewn(buf.bufsize, wchar_t);
    buf.attrptr = buf.attrbuf = snewn(buf.bufsize, int);
    buf.tcptr = buf.tcbuf = snewn(buf.bufsize, truecolour);

    old_top_x = top.x;                 /* needed for rect==1 */

    while (poslt(top, bottom)) {
        bool nl = false;
        termline *ldata = lineptr(top.y);
        pos nlpos;

        /*
         * nlpos will point at the maximum position on this line we
         * should copy up to. So we start it at the end of the
         * line...
         */
        nlpos.y = top.y;
        nlpos.x = term->cols;

        /*
         * ... move it backwards if there's unused space at the end
         * of the line (and also set `nl' if this is the case,
         * because in normal selection mode this means we need a
         * newline at the end)...
         */
        if (!(ldata->lattr & LATTR_WRAPPED)) {
            while (nlpos.x &&
                   IS_SPACE_CHR(ldata->chars[nlpos.x - 1].chr) &&
                   !ldata->chars[nlpos.x - 1].cc_next &&
                   poslt(top, nlpos))
                decpos(nlpos);
            if (poslt(nlpos, bottom))
                nl = true;
        } else {
            if (ldata->trusted) {
                /* A wrapped line with a trust sigil on it terminates
                 * a few characters earlier. */
                nlpos.x = (nlpos.x < TRUST_SIGIL_WIDTH ? 0 :
                           nlpos.x - TRUST_SIGIL_WIDTH);
            }
            if (ldata->lattr & LATTR_WRAPPED2) {
                /* Ignore the last char on the line in a WRAPPED2 line. */
                decpos(nlpos);
            }
        }

        /*
         * ... and then clip it to the terminal x coordinate if
         * we're doing rectangular selection. (In this case we
         * still did the above, so that copying e.g. the right-hand
         * column from a table doesn't fill with spaces on the
         * right.)
         */
        if (rect) {
            if (nlpos.x > bottom.x)
                nlpos.x = bottom.x;
            nl = (top.y < bottom.y);
        }

        while (poslt(top, bottom) && poslt(top, nlpos)) {
#if 0
            char cbuf[16], *p;
            sprintf(cbuf, "<U+%04x>", (ldata[top.x] & 0xFFFF));
#else
            wchar_t cbuf[16], *p;
            int c;
            int x = top.x;

            if (ldata->chars[x].chr == UCSWIDE) {
                top.x++;
                continue;
            }

            while (1) {
                int uc = ldata->chars[x].chr;
                attr = ldata->chars[x].attr;
                tc = ldata->chars[x].truecolour;

                switch (uc & CSET_MASK) {
                  case CSET_LINEDRW:
                    if (!term->rawcnp) {
                        uc = term->ucsdata->unitab_xterm[uc & 0xFF];
                        break;
                    }
                  case CSET_ASCII:
                    uc = term->ucsdata->unitab_line[uc & 0xFF];
                    break;
                  case CSET_SCOACS:
                    uc = term->ucsdata->unitab_scoacs[uc&0xFF];
                    break;
                }
                switch (uc & CSET_MASK) {
                  case CSET_ACP:
                    uc = term->ucsdata->unitab_font[uc & 0xFF];
                    break;
                  case CSET_OEMCP:
                    uc = term->ucsdata->unitab_oemcp[uc & 0xFF];
                    break;
                }

                c = (uc & ~CSET_MASK);
#ifdef PLATFORM_IS_UTF16
                if (uc > 0x10000 && uc < 0x110000) {
                    cbuf[0] = 0xD800 | ((uc - 0x10000) >> 10);
                    cbuf[1] = 0xDC00 | ((uc - 0x10000) & 0x3FF);
                    cbuf[2] = 0;
                } else
#endif
                {
                    cbuf[0] = uc;
                    cbuf[1] = 0;
                }

                if (DIRECT_FONT(uc)) {
                    if (c >= ' ' && c != 0x7F) {
                        char buf[4];
                        WCHAR wbuf[4];
                        int rv;
                        if (is_dbcs_leadbyte(term->ucsdata->font_codepage, (BYTE) c)) {
                            buf[0] = c;
                            buf[1] = (char) (0xFF & ldata->chars[top.x + 1].chr);
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 2, wbuf, 4);
                            top.x++;
                        } else {
                            buf[0] = c;
                            rv = mb_to_wc(term->ucsdata->font_codepage, 0, buf, 1, wbuf, 4);
                        }

                        if (rv > 0) {
                            memcpy(cbuf, wbuf, rv * sizeof(wchar_t));
                            cbuf[rv] = 0;
                        }
                    }
                }
#endif

                for (p = cbuf; *p; p++)
                    clip_addchar(&buf, *p, attr, tc);

                if (ldata->chars[x].cc_next)
                    x += ldata->chars[x].cc_next;
                else
                    break;
            }
            top.x++;
        }
        if (nl) {
            int i;
            for (i = 0; i < sel_nl_sz; i++)
                clip_addchar(&buf, sel_nl[i], 0, term->basic_erase_char.truecolour);
        }
        top.y++;
        top.x = rect ? old_top_x : 0;

        unlineptr(ldata);
    }
#if SELECTION_NUL_TERMINATED
    clip_addchar(&buf, 0, 0, term->basic_erase_char.truecolour);
#endif
    /* Finally, transfer all that to the clipboard(s). */
    {
        int i;
        bool clip_local = false;
        for (i = 0; i < n_clipboards; i++) {
            if (clipboards[i] == CLIP_LOCAL) {
                clip_local = true;
            } else if (clipboards[i] != CLIP_NULL) {
                win_clip_write(
                    term->win, clipboards[i], buf.textbuf, buf.attrbuf,
                    buf.tcbuf, buf.bufpos, desel);
            }
        }
        if (clip_local) {
            sfree(term->last_selected_text);
            sfree(term->last_selected_attr);
            sfree(term->last_selected_tc);
            term->last_selected_text = buf.textbuf;
            term->last_selected_attr = buf.attrbuf;
            term->last_selected_tc = buf.tcbuf;
            term->last_selected_len = buf.bufpos;
        } else {
            sfree(buf.textbuf);
            sfree(buf.attrbuf);
            sfree(buf.tcbuf);
        }
    }
}